

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O1

void __thiscall
icu_63::number::impl::DecimalQuantity::toDecNum
          (DecimalQuantity *this,DecNum *output,UErrorCode *status)

{
  int iVar1;
  byte bVar2;
  uint length;
  ulong uVar3;
  ulong uVar4;
  byte bVar5;
  MaybeStackArray<unsigned_char,_20> ubcd;
  MaybeStackArray<unsigned_char,_20> local_40;
  
  if (this->precision == 0) {
    DecNum::setTo(output,"0",status);
  }
  MaybeStackArray<unsigned_char,_20>::MaybeStackArray(&local_40,this->precision);
  length = this->precision;
  uVar3 = (ulong)length;
  if (0 < (int)length) {
    iVar1 = -1;
    bVar2 = 0;
    uVar4 = 0;
    do {
      if (this->usingBytes == true) {
        bVar5 = (this->fBCD).bcdBytes.ptr[uVar4];
      }
      else if (uVar4 < 0x10) {
        bVar5 = (byte)((this->fBCD).bcdLong >> (bVar2 & 0x3f)) & 0xf;
      }
      else {
        bVar5 = 0;
      }
      local_40.ptr[(int)uVar3 + iVar1] = bVar5;
      uVar4 = uVar4 + 1;
      length = this->precision;
      uVar3 = (ulong)(int)length;
      iVar1 = iVar1 + -1;
      bVar2 = bVar2 + 4;
    } while ((long)uVar4 < (long)uVar3);
  }
  DecNum::setTo(output,local_40.ptr,length,this->scale,(bool)(this->flags & 1),status);
  MaybeStackArray<unsigned_char,_20>::~MaybeStackArray(&local_40);
  return;
}

Assistant:

void DecimalQuantity::toDecNum(DecNum& output, UErrorCode& status) const {
    // Special handling for zero
    if (precision == 0) {
        output.setTo("0", status);
    }

    // Use the BCD constructor. We need to do a little bit of work to convert, though.
    // The decNumber constructor expects most-significant first, but we store least-significant first.
    MaybeStackArray<uint8_t, 20> ubcd(precision);
    for (int32_t m = 0; m < precision; m++) {
        ubcd[precision - m - 1] = static_cast<uint8_t>(getDigitPos(m));
    }
    output.setTo(ubcd.getAlias(), precision, scale, isNegative(), status);
}